

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

int prune_ref_frame(AV1_COMP *cpi,MACROBLOCK *x,MV_REFERENCE_FRAME ref_frame)

{
  byte in_DL;
  MV_REFERENCE_FRAME *in_RSI;
  MACROBLOCK *in_RDI;
  MV_REFERENCE_FRAME rf [2];
  AV1_COMMON *cm;
  MV_REFERENCE_FRAME local_2a [2];
  int *local_28;
  undefined7 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  local_28 = in_RDI[1].picked_ref_frames_mask + 0x1b4;
  av1_set_ref_frame(local_2a,in_DL);
  if ((in_RDI[4].mode_costs.palette_y_color_cost[3][0][0] >> (in_DL & 0x1f) & 1U) == 0) {
    iVar1 = prune_ref_by_selective_ref_frame
                      ((AV1_COMP *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       in_RDI,in_RSI,(uint *)CONCAT17(in_DL,in_stack_ffffffffffffffe0));
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      iVar1 = 1;
    }
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static inline int prune_ref_frame(const AV1_COMP *cpi, const MACROBLOCK *x,
                                  MV_REFERENCE_FRAME ref_frame) {
  const AV1_COMMON *const cm = &cpi->common;
  MV_REFERENCE_FRAME rf[2];
  av1_set_ref_frame(rf, ref_frame);

  if ((cpi->prune_ref_frame_mask >> ref_frame) & 1) return 1;

  if (prune_ref_by_selective_ref_frame(cpi, x, rf,
                                       cm->cur_frame->ref_display_order_hint)) {
    return 1;
  }

  return 0;
}